

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Var::unassign(Var *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  int iVar1;
  element_type *this_00;
  Var **ppVVar2;
  undefined4 extraout_var;
  shared_ptr<kratos::Stmt> local_28;
  shared_ptr<kratos::AssignStmt> *local_18;
  shared_ptr<kratos::AssignStmt> *stmt_local;
  Var *this_local;
  
  local_18 = stmt;
  stmt_local = (shared_ptr<kratos::AssignStmt> *)this;
  this_00 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)stmt);
  ppVVar2 = AssignStmt::right(this_00);
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::erase(&(*ppVVar2)->sinks_,local_18);
  std::
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  ::erase(&this->sources_,local_18);
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>(&local_28,local_18);
  Generator::remove_stmt((Generator *)CONCAT44(extraout_var,iVar1),&local_28);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_28);
  return;
}

Assistant:

void Var::unassign(const std::shared_ptr<AssignStmt> &stmt) {
    // we need to take care of the slices
    stmt->right()->sinks_.erase(stmt);
    sources_.erase(stmt);
    // erase from parent if any
    // TODO: fix this will proper parent
    generator()->remove_stmt(stmt);
}